

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsession.cpp
# Opt level: O0

int __thiscall jrtplib::RTPSession::SetDefaultMark(RTPSession *this,bool m)

{
  int status;
  bool m_local;
  RTPSession *this_local;
  
  if ((this->created & 1U) == 0) {
    this_local._4_4_ = -0x3e;
  }
  else {
    this_local._4_4_ = RTPPacketBuilder::SetDefaultMark(&this->packetbuilder,m);
  }
  return this_local._4_4_;
}

Assistant:

int RTPSession::SetDefaultMark(bool m)
{
	if (!created)
		return ERR_RTP_SESSION_NOTCREATED;

	int status;

	BUILDER_LOCK
	status = packetbuilder.SetDefaultMark(m);
	BUILDER_UNLOCK
	return status;
}